

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

QRect __thiscall
QItemDelegatePrivate::textLayoutBounds
          (QItemDelegatePrivate *this,QStyleOptionViewItem *option,QRect *decorationRect,
          QRect *checkRect)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  QWidget *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  QStyle *pQVar7;
  ulong uVar8;
  double dVar9;
  QSizeF QVar10;
  QRect QVar11;
  
  uVar2 = (option->super_QStyleOption).rect.x1;
  uVar3 = (option->super_QStyleOption).rect.y1;
  QVar11.y1.m_i = uVar3;
  QVar11.x1.m_i = uVar2;
  uVar8._0_4_ = (option->super_QStyleOption).rect.x2;
  uVar8._4_4_ = (option->super_QStyleOption).rect.y2;
  this_00 = option->widget;
  if (this_00 == (QWidget *)0x0) {
    pQVar7 = QApplication::style();
  }
  else {
    pQVar7 = QWidget::style(this_00);
  }
  uVar1 = (option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
          super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i;
  iVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x41,0,this_00);
  iVar5 = iVar5 + 1;
  if (option->decorationPosition - Top < 2) {
    iVar6 = 0x7ffffe;
    if ((uVar1 & 1) != 0) {
      iVar6 = ~(iVar5 * 2) + (option->decorationSize).wd.m_i;
    }
    uVar8 = uVar8 & 0xffffffff00000000 | (ulong)(uint)(iVar6 + uVar2);
  }
  else if (option->decorationPosition < Top) {
    iVar6 = 0x7ffffe;
    if (((uVar1 & 1) != 0) &&
       ((int)uVar3 <= (int)uVar8._4_4_ && (int)uVar2 <= (int)(undefined4)uVar8)) {
      iVar6 = (undefined4)uVar8 - (uVar2 + iVar5 * 2);
    }
    uVar8 = uVar8 & 0xffffffff00000000 | (ulong)(uint)(iVar6 + uVar2);
  }
  if ((uVar1 & 1) != 0) {
    bVar4 = QRect::isNull(decorationRect);
    if (!bVar4) {
      uVar8 = (ulong)(uint)(((~(iVar5 * 2) + (int)uVar8) - (decorationRect->x2).m_i) +
                           (decorationRect->x1).m_i);
    }
    bVar4 = QRect::isNull(checkRect);
    if (!bVar4) {
      uVar8 = (ulong)(uint)(((~(iVar5 * 2) + (int)uVar8) - (checkRect->x2).m_i) +
                           (checkRect->x1).m_i);
    }
    QVar10 = doTextLayout(this,((int)uVar8 - uVar2) + 1);
    dVar9 = ceil(QVar10.ht);
    uVar8 = uVar8 & 0xffffffff | (ulong)(((int)dVar9 + uVar3) - 1) << 0x20;
  }
  QVar11.x2.m_i = (int)uVar8;
  QVar11.y2.m_i = (int)(uVar8 >> 0x20);
  return QVar11;
}

Assistant:

QRect QItemDelegatePrivate::textLayoutBounds(const QStyleOptionViewItem &option,
                                             const QRect &decorationRect, const QRect &checkRect) const
{
    QRect rect = option.rect;
    const QWidget *w = widget(option);
    QStyle *style = w ? w->style() : QApplication::style();
    const bool wrapText = option.features & QStyleOptionViewItem::WrapText;
    // see QItemDelegate::drawDisplay
    const int textMargin = style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, w) + 1;
    switch (option.decorationPosition) {
    case QStyleOptionViewItem::Left:
    case QStyleOptionViewItem::Right:
        rect.setWidth(wrapText && rect.isValid() ? rect.width() - 2 * textMargin : (QFIXED_MAX));
        break;
    case QStyleOptionViewItem::Top:
    case QStyleOptionViewItem::Bottom:
        rect.setWidth(wrapText ? option.decorationSize.width() - 2 * textMargin : (QFIXED_MAX));
        break;
    }

    if (wrapText) {
        if (!decorationRect.isNull())
            rect.setWidth(rect.width() - decorationRect.width() - 2 * textMargin);
        if (!checkRect.isNull())
            rect.setWidth(rect.width() - checkRect.width() - 2 * textMargin);
        // adjust height to be sure that the text fits
        const QSizeF size = doTextLayout(rect.width());
        rect.setHeight(qCeil(size.height()));
    }

    return rect;
}